

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow *window,bool snap_on_edges)

{
  float *pfVar1;
  float fVar2;
  ImGuiContext *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float local_3c;
  float target_y;
  float cr_y;
  float decoration_up_height;
  float target_x;
  float cr_x;
  ImGuiContext *g;
  bool snap_on_edges_local;
  ImGuiWindow *window_local;
  ImVec2 scroll;
  
  pIVar3 = GImGui;
  window_local = *(ImGuiWindow **)&window->Scroll;
  if ((window->ScrollTarget).x <= 3.4028235e+38 && (window->ScrollTarget).x != 3.4028235e+38) {
    fVar6 = (window->ScrollTargetCenterRatio).x;
    cr_y = (window->ScrollTarget).x;
    if (((!snap_on_edges) || (0.0 < fVar6)) || ((window->WindowPadding).x < cr_y)) {
      if (((snap_on_edges) && (1.0 <= fVar6)) &&
         ((window->ContentSize).x + (window->WindowPadding).x + (GImGui->Style).ItemSpacing.x <=
          cr_y)) {
        fVar4 = (window->WindowPadding).x;
        cr_y = fVar4 + fVar4 + (window->ContentSize).x;
      }
    }
    else {
      cr_y = 0.0;
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(window_local._4_4_,
                            -fVar6 * ((window->SizeFull).x - (window->ScrollbarSizes).x) + cr_y);
  }
  pfVar1 = &(window->ScrollTarget).y;
  if (*pfVar1 <= 3.4028235e+38 && *pfVar1 != 3.4028235e+38) {
    fVar4 = ImGuiWindow::TitleBarHeight(window);
    fVar5 = ImGuiWindow::MenuBarHeight(window);
    fVar6 = (window->ScrollTargetCenterRatio).y;
    local_3c = (window->ScrollTarget).y;
    if (((snap_on_edges) && (fVar6 <= 0.0)) && (local_3c <= (window->WindowPadding).y)) {
      local_3c = 0.0;
    }
    if (((snap_on_edges) && (1.0 <= fVar6)) &&
       ((window->ContentSize).y + (window->WindowPadding).y + (pIVar3->Style).ItemSpacing.y <=
        local_3c)) {
      fVar2 = (window->WindowPadding).y;
      local_3c = fVar2 + fVar2 + (window->ContentSize).y;
    }
    window_local = (ImGuiWindow *)
                   CONCAT44(-fVar6 * (((window->SizeFull).y - (window->ScrollbarSizes).y) -
                                     (fVar4 + fVar5)) + local_3c,window_local._0_4_);
  }
  fVar6 = ImMax<float>(window_local._0_4_,0.0);
  fVar4 = ImMax<float>(window_local._4_4_,0.0);
  window_local = (ImGuiWindow *)CONCAT44((float)(int)fVar4,(float)(int)fVar6);
  if (((window->Collapsed & 1U) == 0) && ((window->SkipItems & 1U) == 0)) {
    fVar6 = ImMin<float>((float)(int)fVar6,(window->ScrollMax).x);
    fVar4 = ImMin<float>((float)(int)fVar4,(window->ScrollMax).y);
    window_local = (ImGuiWindow *)CONCAT44(fVar4,fVar6);
  }
  return (ImVec2)window_local;
}

Assistant:

static ImVec2 CalcNextScrollFromScrollTargetAndClamp(ImGuiWindow* window, bool snap_on_edges)
{
    ImGuiContext& g = *GImGui;
    ImVec2 scroll = window->Scroll;
    if (window->ScrollTarget.x < FLT_MAX)
    {
        float cr_x = window->ScrollTargetCenterRatio.x;
        float target_x = window->ScrollTarget.x;
        if (snap_on_edges && cr_x <= 0.0f && target_x <= window->WindowPadding.x)
            target_x = 0.0f;
        else if (snap_on_edges && cr_x >= 1.0f && target_x >= window->ContentSize.x + window->WindowPadding.x + g.Style.ItemSpacing.x)
            target_x = window->ContentSize.x + window->WindowPadding.x * 2.0f;
        scroll.x = target_x - cr_x * (window->SizeFull.x - window->ScrollbarSizes.x);
    }
    if (window->ScrollTarget.y < FLT_MAX)
    {
        // 'snap_on_edges' allows for a discontinuity at the edge of scrolling limits to take account of WindowPadding so that scrolling to make the last item visible scroll far enough to see the padding.
        float decoration_up_height = window->TitleBarHeight() + window->MenuBarHeight();
        float cr_y = window->ScrollTargetCenterRatio.y;
        float target_y = window->ScrollTarget.y;
        if (snap_on_edges && cr_y <= 0.0f && target_y <= window->WindowPadding.y)
            target_y = 0.0f;
        if (snap_on_edges && cr_y >= 1.0f && target_y >= window->ContentSize.y + window->WindowPadding.y + g.Style.ItemSpacing.y)
            target_y = window->ContentSize.y + window->WindowPadding.y * 2.0f;
        scroll.y = target_y - cr_y * (window->SizeFull.y - window->ScrollbarSizes.y - decoration_up_height);
    }
    scroll.x = IM_FLOOR(ImMax(scroll.x, 0.0f));
    scroll.y = IM_FLOOR(ImMax(scroll.y, 0.0f));
    if (!window->Collapsed && !window->SkipItems)
    {
        scroll.x = ImMin(scroll.x, window->ScrollMax.x);
        scroll.y = ImMin(scroll.y, window->ScrollMax.y);
    }
    return scroll;
}